

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void __thiscall GEO::Stopwatch::~Stopwatch(Stopwatch *this)

{
  ostream *poVar1;
  double dVar2;
  
  if (this->verbose_ == true) {
    poVar1 = Logger::out(&this->task_name_);
    std::operator<<(poVar1,"Elapsed time: ");
    dVar2 = SystemStopwatch::elapsed_user_time(&this->W_);
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1," s");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Stopwatch() {
	    if(verbose_) {
		Logger::out(task_name_)
		    << "Elapsed time: " << W_.elapsed_user_time()
		    << " s" << std::endl;
	    }
        }